

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

void sha1_process_message_block(sha1_context *context)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint auStack_1b8 [7];
  undefined1 auStack_199 [21];
  uint auStack_184 [85];
  
  for (lVar8 = 0x21; lVar8 != 0x61; lVar8 = lVar8 + 4) {
    uVar9 = *(uint *)((long)context->intermediate_hash + lVar8 + -3);
    *(uint *)(auStack_199 + lVar8) =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  }
  for (lVar8 = 0x10; lVar8 != 0x50; lVar8 = lVar8 + 1) {
    uVar9 = *(uint *)(auStack_199 + lVar8 * 4 + 1) ^ auStack_184[lVar8] ^ auStack_1b8[lVar8 + 2] ^
            auStack_1b8[lVar8];
    auStack_184[lVar8 + 3] = uVar9 << 1 | (uint)((int)uVar9 < 0);
  }
  uVar1 = context->intermediate_hash[1];
  uVar2 = context->intermediate_hash[2];
  uVar9 = context->intermediate_hash[3];
  uVar3 = context->intermediate_hash[4];
  uVar13 = uVar3;
  uVar6 = context->intermediate_hash[0];
  uVar12 = uVar1;
  uVar7 = uVar2;
  uVar11 = uVar9;
  for (lVar8 = 0; uVar15 = uVar7, uVar16 = uVar6, lVar8 != 0x14; lVar8 = lVar8 + 1) {
    lVar5 = lVar8 + 3;
    iVar17 = (uVar16 << 5 | uVar16 >> 0x1b) + uVar13;
    uVar14 = uVar12 << 0x1e;
    uVar4 = uVar12 >> 2;
    uVar13 = uVar11;
    uVar6 = iVar17 + ((uVar15 ^ uVar11) & uVar12 ^ uVar11) + auStack_184[lVar5] + 0x5a827999;
    uVar12 = uVar16;
    uVar7 = uVar14 | uVar4;
    uVar11 = uVar15;
  }
  for (lVar8 = 0x14; uVar14 = uVar15, lVar8 != 0x28; lVar8 = lVar8 + 1) {
    lVar5 = lVar8 + 3;
    iVar17 = (uVar14 ^ uVar12 ^ uVar11) + (uVar16 << 5 | uVar16 >> 0x1b) + uVar13;
    uVar15 = uVar12 << 0x1e;
    uVar4 = uVar12 >> 2;
    uVar13 = uVar11;
    uVar12 = uVar16;
    uVar15 = uVar15 | uVar4;
    uVar16 = iVar17 + auStack_184[lVar5] + 0x6ed9eba1;
    uVar11 = uVar14;
  }
  for (lVar8 = 0x28; lVar8 != 0x3c; lVar8 = lVar8 + 1) {
    uVar10 = (uVar11 | uVar14) & uVar12;
    lVar5 = lVar8 + 3;
    iVar17 = (uVar16 << 5 | uVar16 >> 0x1b) + uVar13;
    uVar15 = uVar12 << 0x1e;
    uVar4 = uVar12 >> 2;
    uVar13 = uVar11;
    uVar12 = uVar16;
    uVar16 = iVar17 + (uVar11 & uVar14 | uVar10) + auStack_184[lVar5] + 0x8f1bbcdc;
    uVar11 = uVar14;
    uVar14 = uVar15 | uVar4;
  }
  lVar8 = 0x3c;
  while( true ) {
    if (lVar8 == 0x50) break;
    lVar5 = lVar8 + 3;
    iVar17 = (uVar14 ^ uVar12 ^ uVar11) + (uVar16 << 5 | uVar16 >> 0x1b) + uVar13;
    uVar15 = uVar12 << 0x1e;
    uVar4 = uVar12 >> 2;
    lVar8 = lVar8 + 1;
    uVar13 = uVar11;
    uVar12 = uVar16;
    uVar16 = iVar17 + auStack_184[lVar5] + 0xca62c1d6;
    uVar11 = uVar14;
    uVar14 = uVar15 | uVar4;
  }
  context->intermediate_hash[0] = uVar16 + context->intermediate_hash[0];
  context->intermediate_hash[1] = uVar12 + uVar1;
  context->intermediate_hash[2] = uVar14 + uVar2;
  context->intermediate_hash[3] = uVar11 + uVar9;
  context->intermediate_hash[4] = uVar13 + uVar3;
  context->message_block_index = 0;
  return;
}

Assistant:

static void sha1_process_message_block(sha1_context *context)
{
	const uint32_t K[] = {/* Constants defined in SHA-1   */
	                      0x5A827999,
	                      0x6ED9EBA1,
	                      0x8F1BBCDC,
	                      0xCA62C1D6};
	int t; /* Loop counter                */
	uint32_t temp; /* Temporary word value        */
	uint32_t W[80]; /* Word sequence               */
	uint32_t A; /* Word buffers                */
	uint32_t B; /* Word buffers                */
	uint32_t C; /* Word buffers                */
	uint32_t D; /* Word buffers                */
	uint32_t E; /* Word buffers                */

	/*
	 *  Initialize the first 16 words in the array W
	 */
	for (t = 0; t < 16; t++) {
		W[t] = (uint32_t)(context->message_block[t * 4]) << 24U;
		W[t] |= (uint32_t)(context->message_block[t * 4 + 1]) << 16U;
		W[t] |= (uint32_t)(context->message_block[t * 4 + 2]) << 8U;
		W[t] |= (uint32_t)(context->message_block[t * 4 + 3]);
	}

	for (t = 16; t < 80; t++) {
		W[t] = SHA1_CIRCULAR_SHIFT(1U, W[t - 3] ^ W[t - 8] ^ W[t - 14] ^ W[t - 16]);
	}

	A = context->intermediate_hash[0];
	B = context->intermediate_hash[1];
	C = context->intermediate_hash[2];
	D = context->intermediate_hash[3];
	E = context->intermediate_hash[4];

	for (t = 0; t < 20; t++) {
		temp = SHA1_CIRCULAR_SHIFT(5U, A) +
		       ((B & C) | ((~B) & D)) + E + W[t] + K[0];
		E = D;
		D = C;
		C = SHA1_CIRCULAR_SHIFT(30U, B);

		B = A;
		A = temp;
	}

	for (t = 20; t < 40; t++) {
		temp = SHA1_CIRCULAR_SHIFT(5U, A) + (B ^ C ^ D) + E + W[t] + K[1];
		E = D;
		D = C;
		C = SHA1_CIRCULAR_SHIFT(30U, B);
		B = A;
		A = temp;
	}

	for (t = 40; t < 60; t++) {
		temp = SHA1_CIRCULAR_SHIFT(5U, A) +
		       ((B & C) | (B & D) | (C & D)) + E + W[t] + K[2];
		E = D;
		D = C;
		C = SHA1_CIRCULAR_SHIFT(30U, B);
		B = A;
		A = temp;
	}

	for (t = 60; t < 80; t++) {
		temp = SHA1_CIRCULAR_SHIFT(5U, A) + (B ^ C ^ D) + E + W[t] + K[3];
		E = D;
		D = C;
		C = SHA1_CIRCULAR_SHIFT(30U, B);
		B = A;
		A = temp;
	}

	context->intermediate_hash[0] += A;
	context->intermediate_hash[1] += B;
	context->intermediate_hash[2] += C;
	context->intermediate_hash[3] += D;
	context->intermediate_hash[4] += E;

	context->message_block_index = 0;
}